

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch_memory_mapping.c
# Opt level: O2

void x86_cpu_get_memory_mapping_x86_64(CPUState *cs,MemoryMappingList *list)

{
  TranslationBlock *pTVar1;
  TranslationBlock *pTVar2;
  AddressSpace *pAVar3;
  _Bool _Var4;
  uint32_t uVar5;
  uint64_t uVar6;
  uint a20_mask;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  target_ulong tVar11;
  uint local_48;
  
  _Var4 = cpu_paging_enabled(cs);
  if (_Var4) {
    if ((*(uint *)(cs[1].tb_jmp_cache + 0x101) >> 0x13 & 1) == 0) {
      a20_mask = *(uint *)(cs[1].tb_jmp_cache + 0x125);
    }
    else {
      a20_mask = 0xffffffff;
    }
    pTVar1 = cs[1].tb_jmp_cache[0x124];
    if (((ulong)pTVar1 & 0x20) == 0) {
      uVar8 = (ulong)(int)a20_mask;
      pTVar2 = cs[1].tb_jmp_cache[0x123];
      pAVar3 = cs->as;
      for (lVar7 = 0; lVar7 != 0x400; lVar7 = lVar7 + 1) {
        uVar5 = address_space_ldl_x86_64
                          ((uc_struct_conflict *)pAVar3->uc,pAVar3,
                           ((ulong)pTVar2 & uVar8 & 0xfffffffffffff000) + lVar7 * 4 & uVar8,
                           (MemTxAttrs)0x1,(MemTxResult *)0x0);
        if ((uVar5 & 1) != 0) {
          if ((((ulong)pTVar1 & 0x10) == 0) || ((uVar5 & 0x80) == 0)) {
            uVar9 = (ulong)(uVar5 & a20_mask & 0xfffff000);
            for (uVar10 = 0; uVar10 != 0x400000; uVar10 = uVar10 + 0x1000) {
              uVar5 = address_space_ldl_x86_64
                                ((uc_struct_conflict *)pAVar3->uc,pAVar3,uVar9 & uVar8,
                                 (MemTxAttrs)0x1,(MemTxResult *)0x0);
              if ((uVar5 & 1) != 0) {
                _Var4 = cpu_physical_memory_is_io_x86_64(pAVar3,(ulong)(uVar5 & 0xfffff000));
                if (!_Var4) {
                  memory_mapping_list_add_merge_sorted_x86_64
                            (list,(ulong)(uVar5 & 0xfffff000),uVar10 | lVar7 << 0x16,0x1000);
                }
              }
              uVar9 = uVar9 + 4;
            }
          }
          else {
            uVar9 = (ulong)(uVar5 & 0xffc00000) | (ulong)(uVar5 & 0x1fe000) << 0x13;
            _Var4 = cpu_physical_memory_is_io_x86_64(pAVar3,uVar9);
            if (!_Var4) {
              memory_mapping_list_add_merge_sorted_x86_64(list,uVar9,lVar7 << 0x16,0x400000);
            }
          }
        }
      }
    }
    else if ((*(uint *)(cs[1].tb_jmp_cache + 0x101) >> 0xe & 1) == 0) {
      uVar8 = (ulong)(int)a20_mask;
      pTVar1 = cs[1].tb_jmp_cache[0x123];
      pAVar3 = cs->as;
      tVar11 = 0;
      for (lVar7 = 0; lVar7 != 0x20; lVar7 = lVar7 + 8) {
        uVar6 = address_space_ldq_x86_64
                          ((uc_struct_conflict *)pAVar3->uc,pAVar3,
                           lVar7 + ((ulong)pTVar1 & uVar8 & 0xffffffffffffffe0) & uVar8,
                           (MemTxAttrs)0x1,(MemTxResult *)0x0);
        if ((uVar6 & 1) != 0) {
          walk_pde(list,pAVar3,uVar6 & uVar8 & 0xfffffffffffff000,a20_mask,tVar11);
        }
        tVar11 = tVar11 + 0x40000000;
      }
    }
    else {
      uVar8 = (long)(int)a20_mask & 0xffffffffff000;
      uVar9 = (ulong)cs[1].tb_jmp_cache[0x123] & uVar8;
      local_48 = (uint)pTVar1;
      pAVar3 = cs->as;
      if ((local_48 >> 0xc & 1) == 0) {
        walk_pml4e(list,pAVar3,uVar9,a20_mask,0xffff000000000000);
        return;
      }
      for (tVar11 = 0xfe00000000000000; tVar11 != 0; tVar11 = tVar11 + 0x1000000000000) {
        uVar6 = address_space_ldq_x86_64
                          ((uc_struct_conflict *)pAVar3->uc,pAVar3,uVar9 & (long)(int)a20_mask,
                           (MemTxAttrs)0x1,(MemTxResult *)0x0);
        if ((uVar6 & 1) != 0) {
          walk_pml4e(list,pAVar3,uVar6 & uVar8,a20_mask,tVar11);
        }
        uVar9 = uVar9 + 8;
      }
    }
  }
  return;
}

Assistant:

void x86_cpu_get_memory_mapping(CPUState *cs, MemoryMappingList *list)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;
    int32_t a20_mask;

    if (!cpu_paging_enabled(cs)) {
        /* paging is disabled */
        return;
    }

    a20_mask = x86_get_a20_mask(env);
    if (env->cr[4] & CR4_PAE_MASK) {
#ifdef TARGET_X86_64
        if (env->hflags & HF_LMA_MASK) {
            if (env->cr[4] & CR4_LA57_MASK) {
                hwaddr pml5e_addr;

                pml5e_addr = (env->cr[3] & PLM4_ADDR_MASK) & a20_mask;
                walk_pml5e(list, cs->as, pml5e_addr, a20_mask);
            } else {
                hwaddr pml4e_addr;

                pml4e_addr = (env->cr[3] & PLM4_ADDR_MASK) & a20_mask;
                walk_pml4e(list, cs->as, pml4e_addr, a20_mask,
                        0xffffULL << 48);
            }
        } else
#endif
        {
            hwaddr pdpe_addr;

            pdpe_addr = (env->cr[3] & ~0x1f) & a20_mask;
            walk_pdpe2(list, cs->as, pdpe_addr, a20_mask);
        }
    } else {
        hwaddr pde_addr;
        bool pse;

        pde_addr = (env->cr[3] & ~0xfff) & a20_mask;
        pse = !!(env->cr[4] & CR4_PSE_MASK);
        walk_pde2(list, cs->as, pde_addr, a20_mask, pse);
    }
}